

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_abcd_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 src;
  TCGv_i32 dest;
  ulong uVar1;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_flush_flags(s);
  src = gen_extend(s,tcg_ctx->cpu_dregs[insn & 7],0,0);
  uVar1 = (ulong)(insn >> 6 & 0x38);
  dest = gen_extend(s,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar1),0,0);
  bcd_add(tcg_ctx,dest,src);
  gen_partset_reg(tcg_ctx,0,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar1),dest);
  bcd_flags(tcg_ctx,dest);
  return;
}

Assistant:

DISAS_INSN(abcd_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;

    gen_flush_flags(s); /* !Z is sticky */

    src = gen_extend(s, DREG(insn, 0), OS_BYTE, 0);
    dest = gen_extend(s, DREG(insn, 9), OS_BYTE, 0);
    bcd_add(tcg_ctx, dest, src);
    gen_partset_reg(tcg_ctx, OS_BYTE, DREG(insn, 9), dest);

    bcd_flags(tcg_ctx, dest);
}